

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

Index __thiscall
wabt::interp::
FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>::
New<wabt::interp::Global*>
          (FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>
           *this,Global **args)

{
  long *plVar1;
  iterator __position;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  lVar5 = *(long *)(this + 0x20);
  if (*(long *)(this + 0x18) == lVar5) {
    if (*(long *)(this + 8) - *(long *)this >> 3 !=
        (ulong)*(uint *)(this + 0x48) + (*(long *)(this + 0x40) - *(long *)(this + 0x30)) * 8) {
      __assert_fail("list_.size() == is_free_.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/interp-inl.h"
                    ,0x98,
                    "Index wabt::interp::FreeList<std::unique_ptr<wabt::interp::Object>>::New(Args &&...) [T = std::unique_ptr<wabt::interp::Object>, Args = <wabt::interp::Global *>]"
                   );
    }
    std::vector<bool,_std::allocator<bool>_>::push_back
              ((vector<bool,_std::allocator<bool>_> *)(this + 0x30),false);
    __position._M_current =
         *(unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_> **)
          (this + 8);
    if (__position._M_current ==
        *(unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_> **)
         (this + 0x10)) {
      std::
      vector<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>,std::allocator<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>>
      ::_M_realloc_insert<wabt::interp::Global*>
                ((vector<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>,std::allocator<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>>
                  *)this,__position,args);
      lVar5 = *(long *)(this + 8);
    }
    else {
      ((__position._M_current)->_M_t).
      super___uniq_ptr_impl<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>._M_t.
      super__Tuple_impl<0UL,_wabt::interp::Object_*,_std::default_delete<wabt::interp::Object>_>.
      super__Head_base<0UL,_wabt::interp::Object_*,_false>._M_head_impl = (Object *)*args;
      lVar5 = *(long *)(this + 8) + 8;
      *(long *)(this + 8) = lVar5;
    }
    uVar6 = (lVar5 - *(long *)this >> 3) - 1;
  }
  else {
    uVar6 = *(ulong *)(lVar5 + -8);
    uVar2 = uVar6 + 0x3f;
    if (-1 < (long)uVar6) {
      uVar2 = uVar6;
    }
    lVar3 = ((long)uVar2 >> 6) * 8 + *(long *)(this + 0x30);
    uVar4 = (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001);
    uVar2 = *(ulong *)(lVar3 + -8 + uVar4 * 8);
    if ((uVar2 >> (uVar6 & 0x3f) & 1) == 0) {
      __assert_fail("is_free_[index]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/interp-inl.h"
                    ,0x92,
                    "Index wabt::interp::FreeList<std::unique_ptr<wabt::interp::Object>>::New(Args &&...) [T = std::unique_ptr<wabt::interp::Object>, Args = <wabt::interp::Global *>]"
                   );
    }
    *(long *)(this + 0x20) = lVar5 + -8;
    *(ulong *)(lVar3 + uVar4 * 8 + -8) = uVar2 & ~(1L << ((byte)uVar6 & 0x3f));
    plVar1 = *(long **)(*(long *)this + uVar6 * 8);
    *(Global **)(*(long *)this + uVar6 * 8) = *args;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  return uVar6;
}

Assistant:

auto FreeList<T>::New(Args&&... args) -> Index {
  if (!free_.empty()) {
    Index index = free_.back();
    assert(is_free_[index]);
    free_.pop_back();
    is_free_[index] = false;
    list_[index] = T(std::forward<Args>(args)...);
    return index;
  }
  assert(list_.size() == is_free_.size());
  is_free_.push_back(false);
  list_.emplace_back(std::forward<Args>(args)...);
  return list_.size() - 1;
}